

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::Utils::ShaderInterface::GetDefinitionsGlobals_abi_cxx11_
          (string *__return_storage_ptr__,ShaderInterface *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string ShaderInterface::GetDefinitionsGlobals() const
{
	return m_globals;
}